

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O1

void Acb_ObjRemoveFaninFanoutOne(Acb_Ntk_t *p,int iObj,int iFanin)

{
  ulong uVar1;
  uint *puVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *pFanins;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  uint uVar12;
  bool bVar13;
  
  if ((iFanin < 0) || ((p->vFanouts).nSize <= iFanin)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = (p->vFanouts).pArray;
  uVar5 = pVVar3[(uint)iFanin].nSize;
  uVar6 = 0;
  bVar13 = 0 < (int)uVar5;
  if (0 < (int)uVar5) {
    bVar13 = true;
    if (*pVVar3[(uint)iFanin].pArray != iObj) {
      uVar10 = 0;
      do {
        if ((ulong)uVar5 - 1 == uVar10) {
          bVar13 = false;
          uVar6 = (ulong)uVar5;
          goto LAB_003a83c4;
        }
        uVar6 = uVar10 + 1;
        lVar7 = uVar10 + 1;
        uVar10 = uVar6;
      } while (pVVar3[(uint)iFanin].pArray[lVar7] != iObj);
      bVar13 = uVar6 < uVar5;
    }
  }
LAB_003a83c4:
  uVar9 = (uint)uVar6;
  if (uVar9 != uVar5) {
    if (!bVar13) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar12 = uVar5;
    if ((int)(uVar9 + 1) < (int)uVar5) {
      piVar4 = pVVar3[(uint)iFanin].pArray;
      piVar11 = piVar4 + (uVar9 + 1);
      uVar6 = uVar6 & 0xffffffff;
      do {
        iVar8 = (int)uVar6;
        piVar4[uVar6] = *piVar11;
        uVar12 = pVVar3[(uint)iFanin].nSize;
        piVar11 = piVar11 + 1;
        uVar6 = (ulong)(iVar8 + 1);
      } while (iVar8 + 2 < (int)uVar12);
    }
    pVVar3[(uint)iFanin].nSize = uVar12 - 1;
    if (uVar9 != uVar5) {
      if (iObj < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = (p->vObjFans).pArray[(uint)iObj];
      if (((long)iVar8 < 0) || ((p->vFanSto).nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      puVar2 = (uint *)((p->vFanSto).pArray + iVar8);
      uVar5 = *puVar2;
      uVar10 = 0;
      uVar6 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      do {
        if (uVar10 == uVar6) {
          iVar8 = -1;
          goto LAB_003a848b;
        }
        uVar1 = uVar6 + 1;
        lVar7 = uVar6 + 1;
        uVar6 = uVar1;
      } while (puVar2[lVar7] != iFanin);
      iVar8 = (int)uVar1 + -1;
LAB_003a848b:
      lVar7 = (long)iVar8;
      if (puVar2[lVar7 + 1] == iFanin) {
        uVar5 = uVar5 - 1;
        *puVar2 = uVar5;
        if (iVar8 < (int)uVar5) {
          do {
            puVar2[lVar7 + 1] = puVar2[lVar7 + 2];
            lVar7 = lVar7 + 1;
            uVar5 = *puVar2;
          } while (lVar7 < (int)uVar5);
        }
        puVar2[(long)(int)uVar5 + 1] = 0xffffffff;
        return;
      }
      __assert_fail("pFanins[ 1 + iFaninIndex ] == iFanin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                    ,0x1b3,"void Acb_ObjDeleteFanin(Acb_Ntk_t *, int, int)");
    }
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x21a,"void Acb_ObjRemoveFaninFanoutOne(Acb_Ntk_t *, int, int)");
}

Assistant:

static inline void Acb_ObjRemoveFaninFanoutOne( Acb_Ntk_t * p, int iObj, int iFanin )
{
    int RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Acb_ObjDeleteFanin( p, iObj, iFanin );
}